

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,bool is_descriptor,
               GeneratorContext *generator_context)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  ulong uVar4;
  string *psVar5;
  int32 value_00;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  EnumValueDescriptor *local_160;
  EnumValueDescriptor *value;
  undefined1 local_150 [4];
  int i;
  string local_130;
  int local_10c;
  undefined1 local_108 [4];
  int lastindex;
  string fullname;
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_50;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  string filename;
  GeneratorContext *generator_context_local;
  bool is_descriptor_local;
  EnumDescriptor *en_local;
  FileDescriptor *file_local;
  
  GeneratedEnumFileName_abi_cxx11_
            ((string *)&output,(php *)en,(EnumDescriptor *)(ulong)(is_descriptor & 1),
             SUB81(generator_context,0));
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,(string *)&output);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            (&local_50,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1));
  output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_50);
  io::Printer::Printer((Printer *)((long)&fullname.field_2 + 8),output_00,'^');
  GenerateHead(file,(Printer *)((long)&fullname.field_2 + 8));
  FilenameToClassname((string *)local_108,(string *)&output);
  local_10c = std::__cxx11::string::find_last_of(local_108,0x5d00ab);
  FileDescriptor::package_abi_cxx11_(file);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::substr((ulong)&local_130,(ulong)local_108);
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"namespace ^name^;\n\n","name",
                       &local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  GenerateEnumDocComment((Printer *)((long)&fullname.field_2 + 8),en);
  if (local_10c == -1) {
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"class ^name^\n{\n","name",
                       (string *)local_108);
  }
  else {
    std::__cxx11::string::substr((ulong)local_150,(ulong)local_108);
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"class ^name^\n{\n","name",
                       (string *)local_150);
    std::__cxx11::string::~string((string *)local_150);
  }
  Indent((Printer *)((long)&fullname.field_2 + 8));
  value._4_4_ = 0;
  while( true ) {
    iVar1 = value._4_4_;
    iVar2 = EnumDescriptor::value_count(en);
    if (iVar2 <= iVar1) break;
    local_160 = EnumDescriptor::value(en,value._4_4_);
    GenerateEnumValueDocComment((Printer *)((long)&fullname.field_2 + 8),local_160);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_(local_160);
    ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_1a0,psVar5,en);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_(local_160);
    std::operator+(&local_180,&local_1a0,psVar5);
    uVar3 = EnumValueDescriptor::number(local_160);
    IntToString_abi_cxx11_(&local_1c0,(php *)(ulong)uVar3,value_00);
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"const ^name^ = ^number^;\n","name",
                       &local_180,"number",&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    value._4_4_ = value._4_4_ + 1;
  }
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
  std::__cxx11::string::~string((string *)local_108);
  io::Printer::~Printer((Printer *)((long)&fullname.field_2 + 8));
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_50);
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      bool is_descriptor, GeneratorContext* generator_context) {
  std::string filename = GeneratedEnumFileName(en, is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->package().empty()) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateEnumDocComment(&printer, en);

  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ClassNamePrefix(value->name(), en) + value->name(),
                  "number", IntToString(value->number()));
  }

  Outdent(&printer);
  printer.Print("}\n\n");
}